

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

void __thiscall cmSourceFile::SetCustomCommand(cmSourceFile *this,cmCustomCommand *cc)

{
  cmCustomCommand *this_00;
  cmCustomCommand *old;
  cmCustomCommand *cc_local;
  cmSourceFile *this_local;
  
  this_00 = this->CustomCommand;
  this->CustomCommand = cc;
  if (this_00 != (cmCustomCommand *)0x0) {
    cmCustomCommand::~cmCustomCommand(this_00);
    operator_delete(this_00,0x100);
  }
  return;
}

Assistant:

void cmSourceFile::SetCustomCommand(cmCustomCommand* cc)
{
  cmCustomCommand* old = this->CustomCommand;
  this->CustomCommand = cc;
  delete old;
}